

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

streamsize __thiscall
httplib::DataSink::data_sink_streambuf::xsputn(data_sink_streambuf *this,char *s,streamsize n)

{
  std::function<void_(const_char_*,_unsigned_long)>::operator()(&this->sink_->write,s,n);
  return n;
}

Assistant:

std::streamsize xsputn(const char *s, std::streamsize n) {
				sink_.write(s, static_cast<size_t>(n));
				return n;
			}